

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

bool __thiscall cmCTestP4::LoadModifications(cmCTestP4 *this)

{
  pointer pcVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_diff;
  string source;
  OutputLogger err;
  DiffParser out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  _func_int **local_1b0 [2];
  _func_int *local_1a0 [2];
  OutputLogger local_190;
  DiffParser local_150;
  
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  SetP4Options(this,&local_1c8);
  local_150.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x638912;
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,
               (iterator)
               local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(char **)&local_150);
  }
  else {
    *local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
     super__Vector_impl_data._M_finish = "diff";
    local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_150.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x638917;
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,
               (iterator)
               local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(char **)&local_150);
  }
  else {
    *local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
     super__Vector_impl_data._M_finish = "-dn";
    local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  std::__cxx11::string::append((char *)local_1b0);
  local_150.super_LineParser.super_OutputParser._vptr_OutputParser = local_1b0[0];
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,
               (iterator)
               local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(char **)&local_150);
  }
  else {
    *local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (char *)local_1b0[0];
    local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_150.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,
               (iterator)
               local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(char **)&local_150);
  }
  else {
    *local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (char *)0x0;
    local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  DiffParser::DiffParser(&local_150,this,"p4_diff-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_190,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_diff-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,
                      local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&local_150,
                      (OutputParser *)&local_190,(char *)0x0,Auto);
  local_190.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00789028;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.super_LineParser.Line._M_dataplus._M_p !=
      &local_190.super_LineParser.Line.field_2) {
    operator_delete(local_190.super_LineParser.Line._M_dataplus._M_p,
                    local_190.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_150.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_00787b68;
  if (local_150.RegexDiff.program != (char *)0x0) {
    operator_delete__(local_150.RegexDiff.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.CurrentPath._M_dataplus._M_p != &local_150.CurrentPath.field_2) {
    operator_delete(local_150.CurrentPath._M_dataplus._M_p,
                    local_150.CurrentPath.field_2._M_allocated_capacity + 1);
  }
  local_150.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00789028;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.super_LineParser.Line._M_dataplus._M_p !=
      &local_150.super_LineParser.Line.field_2) {
    operator_delete(local_150.super_LineParser.Line._M_dataplus._M_p,
                    local_150.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],(ulong)(local_1a0[0] + 1));
  }
  if (local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool cmCTestP4::LoadModifications()
{
  std::vector<char const*> p4_diff;
  SetP4Options(p4_diff);

  p4_diff.push_back("diff");

  // Ideally we would use -Od but not all clients support it
  p4_diff.push_back("-dn");
  std::string source = this->SourceDirectory + "/...";
  p4_diff.push_back(source.c_str());
  p4_diff.push_back(CM_NULLPTR);

  DiffParser out(this, "p4_diff-out> ");
  OutputLogger err(this->Log, "p4_diff-err> ");
  this->RunChild(&p4_diff[0], &out, &err);
  return true;
}